

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O2

bool __thiscall
SuperCardPro::WriteFlux
          (SuperCardPro *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *flux_times)

{
  pointer puVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  pointer puVar7;
  uint32_t start_len [2];
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  vector<unsigned_short,_std::allocator<unsigned_short>_> flux_data;
  
  flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            (&flux_data,
             (long)(flux_times->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(flux_times->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2);
  puVar1 = (flux_times->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar7 = (flux_times->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    uVar4 = (((*puVar7 + 0xc) / 0x19) * opt.scale) / 100 | 1;
    for (uVar6 = uVar4; 0xffff < uVar6; uVar6 = uVar6 - 0x10000) {
      start_len[0] = (uint)start_len[0]._2_2_ << 0x10;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (&flux_data,(unsigned_short *)start_len);
    }
    uVar3 = (ushort)uVar4;
    start_len[0] = CONCAT22(start_len[0]._2_2_,uVar3 << 8 | uVar3 >> 8);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&flux_data,(unsigned_short *)start_len);
  }
  if (flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start ==
      flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    start_len[0] = CONCAT22(start_len[0]._2_2_,0xa0);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&flux_data,(unsigned_short *)start_len);
  }
  lVar5 = (long)flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start >> 1;
  start_len[0] = 0;
  uVar6 = (int)lVar5 * 2;
  start_len[1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                 (int)lVar5 << 0x19;
  bVar2 = SendCmd(this,0xaa,start_len,8,
                  flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start,uVar6);
  if (bVar2) {
    local_5d = (undefined1)((ulong)lVar5 >> 0x18);
    local_5c = (undefined1)((ulong)lVar5 >> 0x10);
    local_5b = (undefined1)((ulong)lVar5 >> 8);
    local_5a = (undefined1)lVar5;
    local_59 = 5;
    bVar2 = SendCmd(this,0xa2,&local_5d,5,(void *)0x0,0);
  }
  else {
    bVar2 = false;
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return bVar2;
}

Assistant:

bool SuperCardPro::WriteFlux(const std::vector<uint32_t>& flux_times)
{
    std::vector<uint16_t> flux_data;
    flux_data.reserve(flux_times.size());
    for (auto time_ns : flux_times)
    {
        auto time_ticks{ (time_ns + (NS_PER_TICK / 2)) / NS_PER_TICK };
        time_ticks = time_ticks * opt.scale / 100;
        time_ticks |= 1;

        while (time_ticks >= 0x10000)
        {
            flux_data.push_back(0);
            time_ticks -= 0x10000;
        }

        flux_data.push_back(util::htobe(static_cast<uint16_t>(time_ticks)));
    }

    if (flux_data.empty())
        flux_data.push_back(4'000 / NS_PER_TICK);

    auto flux_count{ flux_data.size() };
    auto flux_bytes{ flux_count * sizeof(flux_data[0]) };

    uint32_t start_len[2];
    start_len[0] = 0;
    start_len[1] = util::htobe(static_cast<uint32_t>(flux_bytes));
    if (!SendCmd(CMD_LOADRAM_USB, &start_len, static_cast<int>(sizeof(start_len)), flux_data.data(), static_cast<int>(flux_bytes)))
        return false;

    uint8_t params[5] = {};
    params[0] = static_cast<uint8_t>(flux_count >> 24); // big endian
    params[1] = static_cast<uint8_t>(flux_count >> 16);
    params[2] = static_cast<uint8_t>(flux_count >> 8);
    params[3] = static_cast<uint8_t>(flux_count);
    params[4] = ff_Wipe | ff_Index;

    if (!SendCmd(CMD_WRITEFLUX, &params, sizeof(params)))
        return false;

    return true;
}